

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

void internal_zip_deconstruct_bytes(uint8_t *scratch,uint8_t *source,uint64_t count)

{
  uint8_t uVar1;
  char cVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int d;
  uint8_t *stop;
  uint8_t *raw;
  uint8_t *t2;
  uint8_t *t1;
  int p;
  uint64_t count_local;
  uint8_t *source_local;
  uint8_t *scratch_local;
  
  puVar3 = source;
  t2 = scratch + (count + 1 >> 1);
  t1 = scratch;
  while (raw = puVar3, raw < source + count) {
    puVar3 = raw + 1;
    puVar4 = t1 + 1;
    *t1 = *raw;
    t1 = puVar4;
    if (puVar3 < source + count) {
      *t2 = *puVar3;
      puVar3 = raw + 2;
      t2 = t2 + 1;
    }
  }
  uVar1 = *scratch;
  for (t1 = scratch + 1; t1 < scratch + count; t1 = t1 + 1) {
    cVar2 = *t1 - uVar1;
    uVar1 = *t1;
    *t1 = cVar2 + 0x80;
  }
  return;
}

Assistant:

void internal_zip_deconstruct_bytes (
    uint8_t*       scratch,
    const uint8_t* source,
    uint64_t       count)
{
    int            p;
    uint8_t*       t1   = scratch;
    uint8_t*       t2   = t1 + (count + 1) / 2;
    const uint8_t* raw  = source;
    const uint8_t* stop = raw + count;

    /* reorder */
    while (raw < stop)
    {
        *(t1++) = *(raw++);
        if (raw < stop) *(t2++) = *(raw++);
    }

    /* reorder */
    t1 = scratch;
    t2 = t1 + count;
    t1++;
    p = (int) t1[-1];
    while (t1 < t2)
    {
        int d = (int) (t1[0]) - p + (128 + 256);
        p     = (int) t1[0];
        t1[0] = (uint8_t) d;
        ++t1;
    }
}